

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O2

int ipv6_cb(char *elem,size_t len,void *usr)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  long lVar4;
  byte local_39;
  void *local_38;
  
  iVar1 = *(int *)((long)usr + 0x10);
  lVar4 = (long)iVar1;
  if (lVar4 == 0x10) {
    return 0;
  }
  if (len == 0) {
    if (*(int *)((long)usr + 0x14) == -1) {
      *(int *)((long)usr + 0x14) = iVar1;
    }
    else if (*(int *)((long)usr + 0x14) != iVar1) {
      return 0;
    }
    if (2 < *(int *)((long)usr + 0x18)) {
      return 0;
    }
    *(int *)((long)usr + 0x18) = *(int *)((long)usr + 0x18) + 1;
  }
  else if (len < 5) {
    sVar3 = 0;
    uVar2 = 0;
    local_38 = usr;
    while (len != sVar3) {
      iVar1 = OPENSSL_fromxdigit(&local_39,(int)elem[sVar3]);
      uVar2 = (uint)local_39 | uVar2 << 4;
      sVar3 = sVar3 + 1;
      if (iVar1 == 0) {
        return 0;
      }
    }
    *(ushort *)((long)local_38 + lVar4) = (ushort)uVar2 << 8 | (ushort)uVar2 >> 8;
    *(int *)((long)local_38 + 0x10) = *(int *)((long)local_38 + 0x10) + 2;
  }
  else {
    if (0xc < iVar1) {
      return 0;
    }
    if (elem[len] != '\0') {
      return 0;
    }
    iVar1 = ipv4_from_asc((uint8_t *)(lVar4 + (long)usr),elem);
    if (iVar1 == 0) {
      return 0;
    }
    *(int *)((long)usr + 0x10) = *(int *)((long)usr + 0x10) + 4;
  }
  return 1;
}

Assistant:

static int ipv6_cb(const char *elem, size_t len, void *usr) {
  IPV6_STAT *s = reinterpret_cast<IPV6_STAT *>(usr);
  // Error if 16 bytes written
  if (s->total == 16) {
    return 0;
  }
  if (len == 0) {
    // Zero length element, corresponds to '::'
    if (s->zero_pos == -1) {
      s->zero_pos = s->total;
    } else if (s->zero_pos != s->total) {
      // If we've already got a :: its an error
      return 0;
    }
    if (s->zero_cnt >= 3) {
      // More than three zeros is an error.
      return 0;
    }
    s->zero_cnt++;
  } else {
    // If more than 4 characters could be final a.b.c.d form
    if (len > 4) {
      // Need at least 4 bytes left
      if (s->total > 12) {
        return 0;
      }
      // Must be end of string
      if (elem[len]) {
        return 0;
      }
      if (!ipv4_from_asc(s->tmp + s->total, elem)) {
        return 0;
      }
      s->total += 4;
    } else {
      if (!ipv6_hex(s->tmp + s->total, elem, len)) {
        return 0;
      }
      s->total += 2;
    }
  }
  return 1;
}